

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Imputer::ByteSizeLong(Imputer *this)

{
  bool bVar1;
  ImputedValueCase IVar2;
  ReplaceValueCase RVar3;
  int size;
  int64_t iVar4;
  string *psVar5;
  size_t sVar6;
  long lVar7;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  Imputer *this_local;
  
  _cached_size = 0;
  IVar2 = ImputedValue_case(this);
  switch(IVar2) {
  case IMPUTEDVALUE_NOT_SET:
    break;
  case kImputedDoubleValue:
    _cached_size = 9;
    break;
  case kImputedInt64Value:
    iVar4 = _internal_imputedint64value(this);
    _cached_size = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar4);
    break;
  case kImputedStringValue:
    psVar5 = _internal_imputedstringvalue_abi_cxx11_(this);
    _cached_size = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    _cached_size = _cached_size + 1;
    break;
  case kImputedDoubleArray:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::DoubleVector>
                             ((this->ImputedValue_).imputeddoublearray_);
    _cached_size = _cached_size + 1;
    break;
  case kImputedInt64Array:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::Int64Vector>
                             ((this->ImputedValue_).imputedint64array_);
    _cached_size = _cached_size + 1;
    break;
  case kImputedStringDictionary:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::StringToDoubleMap>
                             ((this->ImputedValue_).imputedstringdictionary_);
    _cached_size = _cached_size + 1;
    break;
  case kImputedInt64Dictionary:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::Int64ToDoubleMap>
                             ((this->ImputedValue_).imputedint64dictionary_);
    _cached_size = _cached_size + 1;
  }
  RVar3 = ReplaceValue_case(this);
  switch(RVar3) {
  case REPLACEVALUE_NOT_SET:
    break;
  case kReplaceDoubleValue:
    _cached_size = _cached_size + 9;
    break;
  case kReplaceInt64Value:
    iVar4 = _internal_replaceint64value(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar4);
    _cached_size = sVar6 + _cached_size;
    break;
  case kReplaceStringValue:
    psVar5 = _internal_replacestringvalue_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    _cached_size = sVar6 + 1 + _cached_size;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar7 = std::__cxx11::string::size();
    _cached_size = lVar7 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t Imputer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Imputer)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (ImputedValue_case()) {
    // double imputedDoubleValue = 1;
    case kImputedDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 imputedInt64Value = 2;
    case kImputedInt64Value: {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64SizePlusOne(this->_internal_imputedint64value());
      break;
    }
    // string imputedStringValue = 3;
    case kImputedStringValue: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_imputedstringvalue());
      break;
    }
    // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
    case kImputedDoubleArray: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputeddoublearray_);
      break;
    }
    // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
    case kImputedInt64Array: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputedint64array_);
      break;
    }
    // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
    case kImputedStringDictionary: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputedstringdictionary_);
      break;
    }
    // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
    case kImputedInt64Dictionary: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputedint64dictionary_);
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (ReplaceValue_case()) {
    // double replaceDoubleValue = 11;
    case kReplaceDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 replaceInt64Value = 12;
    case kReplaceInt64Value: {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64SizePlusOne(this->_internal_replaceint64value());
      break;
    }
    // string replaceStringValue = 13;
    case kReplaceStringValue: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}